

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O3

int __thiscall CMU462::Timeline::previousImportantTime(Timeline *this)

{
  int iVar1;
  long lVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  p_Var3 = (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->times)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (this->current_frame <= (int)p_Var3[1]._M_color) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < this->current_frame];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  if (p_Var4 == (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    iVar1 = -1;
  }
  else {
    lVar2 = std::_Rb_tree_decrement(p_Var4);
    iVar1 = *(int *)(lVar2 + 0x20);
  }
  return iVar1;
}

Assistant:

int Timeline::previousImportantTime() {
  // NOTE : lower bound returns an iter to next > or = element.
  set<int>::iterator iter = times.lower_bound(current_frame);

  if (iter == times.begin()) {
    return -1;
  }

  // Iteratres back one key frame.
  // It we are currently on a key frame,
  // then lower bound would have given us back current_frame.
  iter--;

  return *iter;
}